

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NUMAMemoryPool.cpp
# Opt level: O0

void __thiscall xmrig::NUMAMemoryPool::~NUMAMemoryPool(NUMAMemoryPool *this)

{
  bool bVar1;
  reference ppVar2;
  IMemoryPool *in_RDI;
  pair<const_unsigned_int,_xmrig::IMemoryPool_*> kv;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_xmrig::IMemoryPool_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
  *__range1;
  map<unsigned_int,_xmrig::IMemoryPool_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_> *this_00;
  _Self local_20;
  _Self local_18;
  IMemoryPool *local_10;
  
  in_RDI->_vptr_IMemoryPool = (_func_int **)&PTR__NUMAMemoryPool_002b8c90;
  local_10 = in_RDI + 4;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_xmrig::IMemoryPool_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_xmrig::IMemoryPool_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_> *)
                        0x274c57);
    this_00 = (_Rb_tree_iterator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_> *)
              ppVar2->second;
    if (this_00 != (_Rb_tree_iterator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_> *)0x0) {
      (*(code *)this_00->_M_node->_M_parent)();
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>::operator++
              (this_00);
  }
  std::
  map<unsigned_int,_xmrig::IMemoryPool_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
  ::~map((map<unsigned_int,_xmrig::IMemoryPool_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
          *)0x274c9f);
  IMemoryPool::~IMemoryPool(in_RDI);
  return;
}

Assistant:

xmrig::NUMAMemoryPool::~NUMAMemoryPool()
{
    for (auto kv : m_map) {
        delete kv.second;
    }
}